

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

NodeIterator __thiscall
DirectChainedMap<IdentifierLookupResult>::next
          (DirectChainedMap<IdentifierLookupResult> *this,NodeIterator it)

{
  Node *node;
  Node *pNVar1;
  Node *start;
  Node *pNVar2;
  NodeIterator NVar3;
  
  pNVar2 = it.start;
  pNVar1 = *(Node **)(it.node + 0x18);
  if (pNVar1 != pNVar2) {
    do {
      if (pNVar1 == (Node *)0x0) break;
      if (*(int *)pNVar1 == *(int *)it.node) goto LAB_001edfe1;
      pNVar1 = *(Node **)(pNVar1 + 0x18);
    } while (pNVar1 != pNVar2);
  }
  pNVar2 = (Node *)0x0;
  pNVar1 = (Node *)0x0;
LAB_001edfe1:
  NVar3.node = pNVar1;
  NVar3.start = pNVar2;
  return NVar3;
}

Assistant:

NodeIterator next(NodeIterator it)
	{
		Node *start = it.start;
		Node *node = it.node;

		unsigned hash = node->hash;

		node = node->next;

		if(node == start)
			return NodeIterator();

		while(node)
		{
			if(node->hash == hash)
				return NodeIterator(start, node);

			node = node->next;

			if(node == start)
				return NodeIterator();
		}

		return NodeIterator();
	}